

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::DataSegmentModuleField::~DataSegmentModuleField(DataSegmentModuleField *this)

{
  pointer puVar1;
  Expr *pEVar2;
  pointer pcVar3;
  _func_int ***ppp_Var4;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__DataSegmentModuleField_0155c378;
  puVar1 = (this->data_segment).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pEVar2 = (this->data_segment).offset.first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var4 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  (this->data_segment).offset.first_ = (Expr *)0x0;
  (this->data_segment).offset.last_ = (Expr *)0x0;
  (this->data_segment).offset.size_ = 0;
  Var::~Var(&(this->data_segment).memory_var);
  pcVar3 = (this->data_segment).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->data_segment).name.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit DataSegmentModuleField(const Location& loc = Location(),
                                  string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::DataSegment>(loc),
        data_segment(name) {}